

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_write.cpp
# Opt level: O1

int main(void)

{
  uint8_t *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  long lVar4;
  excerpt_appender appender;
  vanilla_chronicle_settings settings;
  vanilla_chronicle chronicle;
  excerpt_appender local_260;
  vanilla_chronicle_settings local_1f8;
  vanilla_chronicle local_198;
  
  paVar2 = &local_198.m_settings.m_path.field_2;
  local_198.m_settings.m_path._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"/tmp/example","");
  cornelich::vanilla_chronicle_settings::vanilla_chronicle_settings(&local_1f8,(string *)&local_198)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.m_settings.m_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_198.m_settings.m_path._M_dataplus._M_p);
  }
  cornelich::vanilla_chronicle::vanilla_chronicle(&local_198,&local_1f8);
  cornelich::vanilla_chronicle::create_appender(&local_260,&local_198);
  cornelich::excerpt_appender::start_excerpt(&local_260,0x400);
  puVar1 = local_260.m_buffer.m_data + local_260.m_buffer.m_position;
  puVar1[0] = '*';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  local_260.m_buffer.m_position = local_260.m_buffer.m_position + 4;
  cornelich::util::stop_bit::write((int)local_260.m_buffer.m_data,&local_260.m_buffer.m_position,9);
  lVar3 = 0;
  do {
    lVar4 = (long)local_260.m_buffer.m_position;
    local_260.m_buffer.m_position = local_260.m_buffer.m_position + 1;
    local_260.m_buffer.m_data[lVar4] = "Some text"[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 9);
  cornelich::excerpt_appender::finish(&local_260);
  if (local_260.m_data_region.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_260.m_data_region.
               super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_260.m_index_region.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_260.m_index_region.
               super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  boost::multi_index::
  multi_index_container<std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int,_int>,_&std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
  ::~multi_index_container(&local_198.m_data.m_cache.m_container);
  boost::multi_index::
  multi_index_container<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
  ::~multi_index_container(&local_198.m_index.m_cache.m_container);
  if (local_198.m_settings.m_cycle_format.
      super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198.m_settings.m_cycle_format.
               super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.m_settings.m_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_198.m_settings.m_path._M_dataplus._M_p);
  }
  if (local_1f8.m_cycle_format.
      super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.m_cycle_format.
               super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_path._M_dataplus._M_p != &local_1f8.m_path.field_2) {
    operator_delete(local_1f8.m_path._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main()
{
    chr::vanilla_chronicle_settings settings("/tmp/example");
    chr::vanilla_chronicle chronicle(settings);

    auto appender = chronicle.create_appender();
    appender.start_excerpt(1024);
    appender.write(42);
    appender.write("Some text", chr::writers::chars());
    appender.finish();
}